

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

void __thiscall flatbuffers::swift::SwiftGenerator::GenEnum(SwiftGenerator *this,EnumDef *enum_def)

{
  int *piVar1;
  int iVar2;
  SwiftGenerator *this_00;
  Value *pVVar3;
  EnumVal *pEVar4;
  char *__s;
  char *__s_00;
  pointer ppEVar5;
  allocator<char> local_359;
  CodeWriter *local_358;
  allocator<char> local_349;
  EnumDef *local_348;
  string local_340;
  string local_320;
  IdlNamer *local_300;
  SwiftGenerator *local_2f8;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((enum_def->super_Definition).generated == false) {
    local_348 = enum_def;
    if ((((this->super_BaseGenerator).parser_)->opts).swift_implementation_only == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_340,"private",(allocator<char> *)&local_320);
      pVVar3 = SymbolTable<flatbuffers::Value>::Lookup
                         (&(local_348->super_Definition).attributes,&local_340);
      __s = "internal";
      if (pVVar3 == (Value *)0x0) {
        __s = "public";
      }
      std::__cxx11::string::~string((string *)&local_340);
    }
    else {
      __s = "internal";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"ENUM_TYPE",&local_359);
    __s_00 = "Enum, Verifiable";
    if (local_348->is_union != false) {
      __s_00 = "UnionEnum";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,__s_00,&local_349);
    local_358 = &this->code_;
    CodeWriter::SetValue(local_358,&local_340,&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_340,"ACCESS_TYPE",&local_359);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,__s,&local_349);
    CodeWriter::SetValue(local_358,&local_340,&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"ENUM_NAME",&local_359);
    local_300 = &this->namer_;
    IdlNamer::NamespacedType_abi_cxx11_(&local_320,local_300,&local_348->super_Definition);
    CodeWriter::SetValue(local_358,&local_340,&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"BASE_TYPE",&local_359);
    GenTypeBasic_abi_cxx11_(&local_320,this,&local_348->underlying_type,false);
    CodeWriter::SetValue(local_358,&local_340,&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_340);
    GenComment(this,&(local_348->super_Definition).doc_comment);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,
               "{{ACCESS_TYPE}} enum {{ENUM_NAME}}: {{BASE_TYPE}}, {{ENUM_TYPE}} {",
               (allocator<char> *)&local_340);
    CodeWriter::operator+=(local_358,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    piVar1 = &(this->code_).cur_ident_lvl_;
    *piVar1 = *piVar1 + 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"{{ACCESS_TYPE}} typealias T = {{BASE_TYPE}}",
               (allocator<char> *)&local_340);
    CodeWriter::operator+=(local_358,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    if (local_348->is_union == true) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"",(allocator<char> *)&local_340);
      CodeWriter::operator+=(local_358,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"{{ACCESS_TYPE}} init?(value: T) {",
                 (allocator<char> *)&local_340);
      CodeWriter::operator+=(local_358,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      piVar1 = &(this->code_).cur_ident_lvl_;
      *piVar1 = *piVar1 + 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"self.init(rawValue: value)",(allocator<char> *)&local_340);
      CodeWriter::operator+=(local_358,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      iVar2 = (this->code_).cur_ident_lvl_;
      if (iVar2 != 0) {
        (this->code_).cur_ident_lvl_ = iVar2 + -1;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"}\n",(allocator<char> *)&local_340);
      CodeWriter::operator+=(local_358,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,
               "{{ACCESS_TYPE}} static var byteSize: Int { return MemoryLayout<{{BASE_TYPE}}>.size }"
               ,(allocator<char> *)&local_340);
    CodeWriter::operator+=(local_358,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,
               "{{ACCESS_TYPE}} var value: {{BASE_TYPE}} { return self.rawValue }",
               (allocator<char> *)&local_340);
    local_2f8 = this;
    CodeWriter::operator+=(local_358,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    for (ppEVar5 = (local_348->vals).vec.
                   super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppEVar5 !=
        (local_348->vals).vec.
        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppEVar5 = ppEVar5 + 1) {
      pEVar4 = *ppEVar5;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"KEY",&local_359);
      IdlNamer::LegacySwiftVariant_abi_cxx11_(&local_320,local_300,pEVar4);
      CodeWriter::SetValue(local_358,&local_340,&local_320);
      std::__cxx11::string::~string((string *)&local_320);
      std::__cxx11::string::~string((string *)&local_340);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"VALUE",&local_359);
      EnumDef::ToString_abi_cxx11_(&local_320,local_348,pEVar4);
      CodeWriter::SetValue(local_358,&local_340,&local_320);
      std::__cxx11::string::~string((string *)&local_320);
      std::__cxx11::string::~string((string *)&local_340);
      GenComment(local_2f8,&pEVar4->doc_comment);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"case {{KEY}} = {{VALUE}}",(allocator<char> *)&local_340);
      CodeWriter::operator+=(local_358,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,"",(allocator<char> *)&local_340);
    CodeWriter::operator+=(local_358,&local_170);
    this_00 = local_2f8;
    std::__cxx11::string::~string((string *)&local_170);
    pEVar4 = EnumDef::MaxValue(local_348);
    IdlNamer::LegacySwiftVariant_abi_cxx11_(&local_340,local_300,pEVar4);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"max",&local_359);
    AddMinOrMaxEnumValue(this_00,&local_340,&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_340);
    pEVar4 = EnumDef::MinValue(local_348);
    IdlNamer::LegacySwiftVariant_abi_cxx11_(&local_340,local_300,pEVar4);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"min",&local_359);
    AddMinOrMaxEnumValue(this_00,&local_340,&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_340);
    iVar2 = (this_00->code_).cur_ident_lvl_;
    if (iVar2 != 0) {
      (this_00->code_).cur_ident_lvl_ = iVar2 + -1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_190,"}\n",(allocator<char> *)&local_340);
    CodeWriter::operator+=(local_358,&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    if ((((this_00->super_BaseGenerator).parser_)->opts).gen_json_coders == true) {
      EnumEncoder(this_00,local_348);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"",(allocator<char> *)&local_340);
    CodeWriter::operator+=(local_358,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    if (((((this_00->super_BaseGenerator).parser_)->opts).generate_object_based_api == true) &&
       (local_348->is_union == true)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"{{ACCESS_TYPE}} struct {{ENUM_NAME}}Union {",
                 (allocator<char> *)&local_340);
      CodeWriter::operator+=(local_358,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      piVar1 = &(this_00->code_).cur_ident_lvl_;
      *piVar1 = *piVar1 + 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f0,"{{ACCESS_TYPE}} var type: {{ENUM_NAME}}",
                 (allocator<char> *)&local_340);
      CodeWriter::operator+=(local_358,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,"{{ACCESS_TYPE}} var value: NativeObject?",
                 (allocator<char> *)&local_340);
      CodeWriter::operator+=(local_358,&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_230,
                 "{{ACCESS_TYPE}} init(_ v: NativeObject?, type: {{ENUM_NAME}}) {",
                 (allocator<char> *)&local_340);
      CodeWriter::operator+=(local_358,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      piVar1 = &(this_00->code_).cur_ident_lvl_;
      *piVar1 = *piVar1 + 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_250,"self.type = type",(allocator<char> *)&local_340);
      CodeWriter::operator+=(local_358,&local_250);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,"self.value = v",(allocator<char> *)&local_340);
      CodeWriter::operator+=(local_358,&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      iVar2 = (this_00->code_).cur_ident_lvl_;
      if (iVar2 != 0) {
        (this_00->code_).cur_ident_lvl_ = iVar2 + -1;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_290,"}",(allocator<char> *)&local_340);
      CodeWriter::operator+=(local_358,&local_290);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b0,
                 "{{ACCESS_TYPE}} func pack(builder: inout FlatBufferBuilder) -> Offset {",
                 (allocator<char> *)&local_340);
      CodeWriter::operator+=(local_358,&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      piVar1 = &(this_00->code_).cur_ident_lvl_;
      *piVar1 = *piVar1 + 1;
      BuildUnionEnumSwitchCaseWritter(this_00,local_348);
      iVar2 = (this_00->code_).cur_ident_lvl_;
      if (iVar2 != 0) {
        (this_00->code_).cur_ident_lvl_ = iVar2 + -1;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2d0,"}",(allocator<char> *)&local_340);
      CodeWriter::operator+=(local_358,&local_2d0);
      std::__cxx11::string::~string((string *)&local_2d0);
      iVar2 = (this_00->code_).cur_ident_lvl_;
      if (iVar2 != 0) {
        (this_00->code_).cur_ident_lvl_ = iVar2 + -1;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f0,"}",(allocator<char> *)&local_340);
      CodeWriter::operator+=(local_358,&local_2f0);
      std::__cxx11::string::~string((string *)&local_2f0);
    }
  }
  return;
}

Assistant:

void GenEnum(const EnumDef &enum_def) {
    if (enum_def.generated) return;
    const bool is_private_access =
        parser_.opts.swift_implementation_only ||
        enum_def.attributes.Lookup("private") != nullptr;
    code_.SetValue("ENUM_TYPE",
                   enum_def.is_union ? "UnionEnum" : "Enum, Verifiable");
    code_.SetValue("ACCESS_TYPE", is_private_access ? "internal" : "public");
    code_.SetValue("ENUM_NAME", namer_.NamespacedType(enum_def));
    code_.SetValue("BASE_TYPE", GenTypeBasic(enum_def.underlying_type, false));
    GenComment(enum_def.doc_comment);
    code_ +=
        "{{ACCESS_TYPE}} enum {{ENUM_NAME}}: {{BASE_TYPE}}, {{ENUM_TYPE}} {";
    Indent();
    code_ += "{{ACCESS_TYPE}} typealias T = {{BASE_TYPE}}";
    if (enum_def.is_union) {
      code_ += "";
      code_ += "{{ACCESS_TYPE}} init?(value: T) {";
      Indent();
      code_ += "self.init(rawValue: value)";
      Outdent();
      code_ += "}\n";
    }
    code_ +=
        "{{ACCESS_TYPE}} static var byteSize: Int { return "
        "MemoryLayout<{{BASE_TYPE}}>.size "
        "}";
    code_ +=
        "{{ACCESS_TYPE}} var value: {{BASE_TYPE}} { return self.rawValue }";
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      const auto &ev = **it;
      code_.SetValue("KEY", namer_.LegacySwiftVariant(ev));
      code_.SetValue("VALUE", enum_def.ToString(ev));
      GenComment(ev.doc_comment);
      code_ += "case {{KEY}} = {{VALUE}}";
    }
    code_ += "";
    AddMinOrMaxEnumValue(namer_.LegacySwiftVariant(*enum_def.MaxValue()),
                         "max");
    AddMinOrMaxEnumValue(namer_.LegacySwiftVariant(*enum_def.MinValue()),
                         "min");
    Outdent();
    code_ += "}\n";
    if (parser_.opts.gen_json_coders) EnumEncoder(enum_def);
    code_ += "";
    if (parser_.opts.generate_object_based_api && enum_def.is_union) {
      code_ += "{{ACCESS_TYPE}} struct {{ENUM_NAME}}Union {";
      Indent();
      code_ += "{{ACCESS_TYPE}} var type: {{ENUM_NAME}}";
      code_ += "{{ACCESS_TYPE}} var value: NativeObject?";
      code_ +=
          "{{ACCESS_TYPE}} init(_ v: NativeObject?, type: {{ENUM_NAME}}) {";
      Indent();
      code_ += "self.type = type";
      code_ += "self.value = v";
      Outdent();
      code_ += "}";
      code_ +=
          "{{ACCESS_TYPE}} func pack(builder: inout FlatBufferBuilder) -> "
          "Offset {";
      Indent();
      BuildUnionEnumSwitchCaseWritter(enum_def);
      Outdent();
      code_ += "}";
      Outdent();
      code_ += "}";
    }
  }